

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * MulInv_QV(QMatrix *Q,Vector *V)

{
  double dVar1;
  double dVar2;
  Boolean BVar3;
  double Dim;
  size_t *psVar4;
  ElType **ppEVar5;
  Real *pRVar6;
  Real *pRVar7;
  Real *pRVar8;
  double dVar9;
  ElOrderType EVar10;
  LASErrIdType LVar11;
  Vector *V_00;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  double dVar17;
  double dVar18;
  Real *pRVar19;
  size_t sVar20;
  ElType *pEVar21;
  bool bVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  ElOrderType local_4c;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar11 = LASResult();
  if (LVar11 != LASOK) {
    V_00 = (Vector *)0x0;
    goto LAB_0010bce2;
  }
  Dim = (double)Q->Dim;
  if (Dim != (double)V->Dim) {
    pcVar12 = Q_GetName(Q);
    pcVar15 = V_GetName(V);
    V_00 = (Vector *)0x0;
    LASError(LASDimErr,"MulInv_QV",pcVar12,pcVar15,(char *)0x0);
    goto LAB_0010bce2;
  }
  V_00 = (Vector *)malloc(0x30);
  pcVar12 = Q_GetName(Q);
  sVar13 = strlen(pcVar12);
  pcVar12 = V_GetName(V);
  sVar14 = strlen(pcVar12);
  pcVar12 = (char *)malloc(sVar13 + sVar14 + 0x14);
  pcVar15 = Q_GetName(Q);
  pcVar16 = V_GetName(V);
  if ((V_00 == (Vector *)0x0) || (pcVar12 == (char *)0x0)) {
    LASError(LASMemAllocErr,"MulInv_QV",pcVar15,pcVar16,(char *)0x0);
    free(V_00);
  }
  else {
    sprintf(pcVar12,"(%s)^(-1) * (%s)",pcVar15,pcVar16);
    V_Constr(V_00,pcVar12,(size_t)Dim,Tempor,True);
    Q_SortEl(Q);
    Q_AllocInvDiagEl(Q);
    LVar11 = LASResult();
    if ((((LVar11 != LASOK) || (*Q->ElSorted == False)) || (*Q->ZeroInDiag != False)) ||
       (dVar18 = Q->MultiplD, ABS(dVar18) < 2.2250738585072014e-307)) {
      LVar11 = LASResult();
      if ((LVar11 == LASOK) && (*Q->ElSorted == False)) {
        pcVar15 = Q_GetName(Q);
        pcVar16 = V_GetName(V);
        LASError(LASElNotSortedErr,"MulInv_QV",pcVar15,pcVar16,(char *)0x0);
      }
      LVar11 = LASResult();
      if ((LVar11 == LASOK) &&
         ((*Q->ZeroInDiag != False || (ABS(Q->MultiplD) < 2.2250738585072014e-307)))) {
        pcVar15 = Q_GetName(Q);
        pcVar16 = V_GetName(V);
        LVar11 = LASZeroInDiagErr;
        goto LAB_0010bc79;
      }
    }
    else {
      psVar4 = Q->Len;
      ppEVar5 = Q->El;
      pRVar6 = Q->InvDiagEl;
      pRVar7 = V->Cmp;
      pRVar8 = V_00->Cmp;
      if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
        V_SetAllCmp(V_00,0.0);
        dVar18 = Q->MultiplD;
      }
      dVar24 = 1.0 / dVar18;
      dVar29 = Q->MultiplU;
      dVar1 = Q->MultiplL;
      dVar2 = V->Multipl;
      dVar26 = ABS(dVar29);
      dVar25 = ABS(dVar1);
      dVar27 = ABS(dVar24 + -1.0);
      dVar28 = ABS(dVar2 + -1.0);
      if (((2.2250738585072014e-307 <= ABS(dVar24)) && (dVar26 < 2.2250738585072014e-307)) &&
         (dVar25 < 2.2250738585072014e-307)) {
        dVar17 = 4.94065645841247e-324;
        if (2.220446049250313e-15 <= ABS(dVar2 / dVar18 + -1.0)) {
          for (; (ulong)dVar17 <= (ulong)Dim; dVar17 = (double)((long)dVar17 + 1)) {
            pRVar8[(long)dVar17] = pRVar7[(long)dVar17] * (dVar2 / dVar18) * pRVar6[(long)dVar17];
          }
        }
        else {
          for (; (ulong)dVar17 <= (ulong)Dim; dVar17 = (double)((long)dVar17 + 1)) {
            pRVar8[(long)dVar17] = pRVar7[(long)dVar17] * pRVar6[(long)dVar17];
          }
        }
      }
      if ((2.2250738585072014e-307 <= dVar26) && (dVar25 < 2.2250738585072014e-307)) {
        if (Q->ElOrder == Rowws) {
          uVar23 = -(ulong)(ABS(dVar29 + -1.0) < 2.220446049250313e-15);
          dVar18 = Dim;
          while (dVar18 != 0.0) {
            sVar20 = psVar4[(long)dVar18];
            dVar17 = 0.0;
            for (pRVar19 = &ppEVar5[(long)dVar18][sVar20 - 1].Val;
                (bVar22 = sVar20 != 0, sVar20 = sVar20 - 1, bVar22 &&
                ((ulong)dVar18 < ((ElType *)(pRVar19 + -1))->Pos)); pRVar19 = pRVar19 + -2) {
              dVar17 = dVar17 - *pRVar19 * pRVar8[((ElType *)(pRVar19 + -1))->Pos];
            }
            dVar17 = (double)((ulong)dVar17 & uVar23 | ~uVar23 & (ulong)(dVar29 * dVar17));
            dVar17 = (double)(~-(ulong)(dVar28 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar18] * dVar2 + dVar17) |
                             (ulong)(dVar17 + pRVar7[(long)dVar18]) &
                             -(ulong)(dVar28 < 2.220446049250313e-15));
            pRVar8[(long)dVar18] =
                 (double)(~-(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)(dVar17 * dVar24) |
                         -(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)dVar17) *
                 pRVar6[(long)dVar18];
            dVar18 = (double)((long)dVar18 + -1);
          }
        }
        else if (Q->ElOrder == Clmws) {
          uVar23 = -(ulong)(ABS(dVar29 + -1.0) < 2.220446049250313e-15);
          dVar18 = Dim;
          while (dVar17 = dVar18, dVar17 != 0.0) {
            dVar18 = (double)(~uVar23 & (ulong)(dVar29 * pRVar8[(long)dVar17]) |
                             (ulong)pRVar8[(long)dVar17] & uVar23);
            dVar18 = (double)(~-(ulong)(dVar28 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar17] * dVar2 + dVar18) |
                             (ulong)(dVar18 + pRVar7[(long)dVar17]) &
                             -(ulong)(dVar28 < 2.220446049250313e-15));
            dVar30 = (double)(~-(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)(dVar18 * dVar24) |
                             -(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)dVar18) *
                     pRVar6[(long)dVar17];
            pRVar8[(long)dVar17] = dVar30;
            sVar20 = psVar4[(long)dVar17];
            for (pEVar21 = ppEVar5[(long)dVar17];
                (bVar22 = sVar20 != 0, sVar20 = sVar20 - 1, dVar18 = (double)((long)dVar17 + -1),
                bVar22 && (dVar9 = (double)pEVar21->Pos, (ulong)dVar9 < (ulong)dVar17));
                pEVar21 = pEVar21 + 1) {
              pRVar8[(long)dVar9] = pRVar8[(long)dVar9] - pEVar21->Val * dVar30;
            }
          }
        }
      }
      if (dVar26 < 2.2250738585072014e-307 && 2.2250738585072014e-307 <= dVar25) {
        BVar3 = Q->Symmetry;
        local_4c = Q->ElOrder;
        if (BVar3 == False) {
          if (local_4c == Rowws) {
            local_4c = Rowws;
            EVar10 = local_4c;
            goto LAB_0010c13d;
          }
LAB_0010c244:
          if (local_4c == Clmws) goto LAB_0010c24d;
        }
        else {
          EVar10 = Clmws;
          if (local_4c == Clmws) {
LAB_0010c13d:
            local_4c = EVar10;
            uVar23 = -(ulong)(ABS(dVar1 + -1.0) < 2.220446049250313e-15);
            for (dVar18 = 4.94065645841247e-324; (ulong)dVar18 <= (ulong)Dim;
                dVar18 = (double)((long)dVar18 + 1)) {
              sVar20 = psVar4[(long)dVar18];
              dVar29 = 0.0;
              for (pEVar21 = ppEVar5[(long)dVar18];
                  (bVar22 = sVar20 != 0, sVar20 = sVar20 - 1, bVar22 &&
                  (pEVar21->Pos < (ulong)dVar18)); pEVar21 = pEVar21 + 1) {
                dVar29 = dVar29 - pEVar21->Val * pRVar8[pEVar21->Pos];
              }
              dVar29 = (double)((ulong)dVar29 & uVar23 | ~uVar23 & (ulong)(dVar1 * dVar29));
              dVar29 = (double)(~-(ulong)(dVar28 < 2.220446049250313e-15) &
                                (ulong)(pRVar7[(long)dVar18] * dVar2 + dVar29) |
                               (ulong)(dVar29 + pRVar7[(long)dVar18]) &
                               -(ulong)(dVar28 < 2.220446049250313e-15));
              pRVar8[(long)dVar18] =
                   (double)(~-(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)(dVar29 * dVar24) |
                           -(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)dVar29) *
                   pRVar6[(long)dVar18];
            }
            if (BVar3 == False) goto LAB_0010c244;
          }
          if (local_4c == Rowws) {
LAB_0010c24d:
            uVar23 = -(ulong)(ABS(dVar1 + -1.0) < 2.220446049250313e-15);
            for (dVar18 = 4.94065645841247e-324; (ulong)dVar18 <= (ulong)Dim;
                dVar18 = (double)((long)dVar18 + 1)) {
              dVar29 = (double)(~uVar23 & (ulong)(dVar1 * pRVar8[(long)dVar18]) |
                               (ulong)pRVar8[(long)dVar18] & uVar23);
              dVar29 = (double)(~-(ulong)(dVar28 < 2.220446049250313e-15) &
                                (ulong)(pRVar7[(long)dVar18] * dVar2 + dVar29) |
                               (ulong)(dVar29 + pRVar7[(long)dVar18]) &
                               -(ulong)(dVar28 < 2.220446049250313e-15));
              dVar29 = (double)(~-(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)(dVar29 * dVar24)
                               | -(ulong)(dVar27 < 2.220446049250313e-15) & (ulong)dVar29) *
                       pRVar6[(long)dVar18];
              pRVar8[(long)dVar18] = dVar29;
              sVar20 = psVar4[(long)dVar18];
              for (pRVar19 = &ppEVar5[(long)dVar18][sVar20 - 1].Val;
                  (bVar22 = sVar20 != 0, sVar20 = sVar20 - 1, bVar22 &&
                  (dVar17 = (double)((ElType *)(pRVar19 + -1))->Pos, (ulong)dVar18 < (ulong)dVar17))
                  ; pRVar19 = pRVar19 + -2) {
                pRVar8[(long)dVar17] = pRVar8[(long)dVar17] - *pRVar19 * dVar29;
              }
            }
          }
        }
      }
      if ((2.2250738585072014e-307 <= dVar26) && (2.2250738585072014e-307 <= dVar25)) {
        pcVar15 = Q_GetName(Q);
        pcVar16 = V_GetName(V);
        LVar11 = LASMulInvErr;
LAB_0010bc79:
        LASError(LVar11,"MulInv_QV",pcVar15,pcVar16,(char *)0x0);
      }
    }
  }
  free(pcVar12);
LAB_0010bce2:
  Q_Unlock(Q);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *MulInv_QV(QMatrix *Q, Vector *V)
/* VRes = Q^(-1) * V, this operation is limited to diagonal or triangular
   matrices */
{
    Vector *VRes;

    char *VResName;
    double MultiplD, MultiplU, MultiplL, MultiplV, MultiplDV;
    double Sum, Cmp;
    size_t Dim, Row, Clm, Ind, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDIsZero, MultiplUIsZero, MultiplLIsZero;
    Boolean MultiplDIsOne, MultiplUIsOne, MultiplLIsOne, MultiplVIsOne,
        MultiplDVIsOne;
    ElType **QEl, *PtrEl;
    Real *QInvDiagEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 20)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s)^(-1) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);

                /* sort of elements and allocation of the inverse of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && *Q->ElSorted && !(*Q->ZeroInDiag)
                    && !IsZero(Q->MultiplD)) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QInvDiagEl = Q->InvDiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplD = 1.0 / Q->MultiplD;  /* attention here !!! */
                    MultiplU = Q->MultiplU;
                    MultiplL = Q->MultiplL;
                    MultiplV = V->Multipl;
                    MultiplDV = V->Multipl / Q->MultiplD;  /* attention here !!! */
                    MultiplDIsZero = IsZero(MultiplD);
                    MultiplUIsZero = IsZero(MultiplU);
                    MultiplLIsZero = IsZero(MultiplL);
                    MultiplDIsOne = IsOne(MultiplD);
                    MultiplUIsOne = IsOne(MultiplU);
                    MultiplLIsOne = IsOne(MultiplL);
                    MultiplVIsOne = IsOne(MultiplV);
                    MultiplDVIsOne = IsOne(MultiplDV);

                    /* multiplication of the vector V by the inverse matrix
                       of the diagonal of M */
                    if (!MultiplDIsZero && MultiplUIsZero && MultiplLIsZero) {
                        if (MultiplDVIsOne) {
                           for_AllCmp
                                VResCmp[Ind] = VCmp[Ind] * QInvDiagEl[Ind];
                        } else {
                           for_AllCmp
                                VResCmp[Ind] = MultiplDV * VCmp[Ind] * QInvDiagEl[Ind];
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix
                       of the upper triangular part of M */
                    if (!MultiplUIsZero && MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Row = Dim; Row >= 1; Row--) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row] + Len - 1;
                                Sum = 0.0;
                                  for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl--;
                                }
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Clm = Dim; Clm >= 1; Clm--) {
                                Sum = VResCmp[Clm];
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix 
                       of the lower triangular part of M */
                    if (MultiplUIsZero && !MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                Sum = 0.0;
                                       for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Sum = VResCmp[Clm];
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm] + Len - 1;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl--;
                                }
                            }
                        }
                    }
                    if (!MultiplUIsZero && !MultiplLIsZero) {
                        LASError(LASMulInvErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    if (LASResult() == LASOK && (*Q->ZeroInDiag || IsZero(Q->MultiplD)))
                        LASError(LASZeroInDiagErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}